

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monitor.h
# Opt level: O2

void __thiscall Monitor::stop(Monitor *this)

{
  this->stopped = 1;
  gettimeofday((timeval *)&this->endCount,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

inline void stop() {
		stopped = 1; // set timer stopped flag
		#ifdef _WIN32
		QueryPerformanceCounter(&endCount);
		#else
		gettimeofday(&endCount, NULL);
		#endif
	}